

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>
               (SnapObject *snpObject,FileWriter *writer)

{
  uint32 *puVar1;
  ulong uVar2;
  
  if (snpObject->SnapObjectTag == SnapES5HeapArgumentsObject) {
    puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
    FileWriter::WriteUInt32(writer,numberOfArgs,*puVar1,CommaAndBigSpaceSeparator);
    (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(byte)puVar1[1],1);
    FileWriter::WriteAddr(writer,objectId,*(TTD_PTR_ID *)(puVar1 + 2),CommaSeparator);
    FileWriter::WriteLengthValue(writer,puVar1[4],CommaSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x48,1);
    (*writer->_vptr_FileWriter[4])(writer,0);
    if (puVar1[4] != 0) {
      uVar2 = 0;
      do {
        (*writer->_vptr_FileWriter[0xb])
                  (writer,(ulong)*(byte *)(*(long *)(puVar1 + 6) + uVar2),(ulong)(uVar2 != 0));
        uVar2 = uVar2 + 1;
      } while (uVar2 < puVar1[4]);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void EmitAddtlInfo_SnapHeapArgumentsInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapHeapArgumentsInfo* argsInfo = SnapObjectGetAddtlInfoAs<SnapHeapArgumentsInfo*, argsKind>(snpObject);

            writer->WriteUInt32(NSTokens::Key::numberOfArgs, argsInfo->NumOfArguments, NSTokens::Separator::CommaAndBigSpaceSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, argsInfo->IsFrameNullPtr, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::objectId, argsInfo->FrameObject, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(argsInfo->FormalCount, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::deletedArgs, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < argsInfo->FormalCount; ++i)
            {
                writer->WriteNakedByte(argsInfo->DeletedArgFlags[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }